

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O0

void transpose_32bit_4x4(__m128i *in,__m128i *out)

{
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  __m128i *out_local;
  __m128i *in_local;
  
  local_d8 = (undefined4)(*in)[0];
  uStack_d4 = (undefined4)((ulong)(*in)[0] >> 0x20);
  local_e8 = (undefined4)in[1][0];
  uStack_e4 = (undefined4)((ulong)in[1][0] >> 0x20);
  local_f8 = (undefined4)in[2][0];
  uStack_f4 = (undefined4)((ulong)in[2][0] >> 0x20);
  local_108 = (undefined4)in[3][0];
  uStack_104 = (undefined4)((ulong)in[3][0] >> 0x20);
  uStack_90 = (undefined4)(*in)[1];
  uStack_8c = (undefined4)((ulong)(*in)[1] >> 0x20);
  uStack_a0 = (undefined4)in[1][1];
  uStack_9c = (undefined4)((ulong)in[1][1] >> 0x20);
  uStack_b0 = (undefined4)in[2][1];
  uStack_ac = (undefined4)((ulong)in[2][1] >> 0x20);
  uStack_c0 = (undefined4)in[3][1];
  uStack_bc = (undefined4)((ulong)in[3][1] >> 0x20);
  *(undefined4 *)*out = local_d8;
  *(undefined4 *)((long)*out + 4) = local_e8;
  *(undefined4 *)(*out + 1) = local_f8;
  *(undefined4 *)((long)*out + 0xc) = local_108;
  *(undefined4 *)out[1] = uStack_d4;
  *(undefined4 *)((long)out[1] + 4) = uStack_e4;
  *(undefined4 *)(out[1] + 1) = uStack_f4;
  *(undefined4 *)((long)out[1] + 0xc) = uStack_104;
  *(undefined4 *)out[2] = uStack_90;
  *(undefined4 *)((long)out[2] + 4) = uStack_a0;
  *(undefined4 *)(out[2] + 1) = uStack_b0;
  *(undefined4 *)((long)out[2] + 0xc) = uStack_c0;
  *(undefined4 *)out[3] = uStack_8c;
  *(undefined4 *)((long)out[3] + 4) = uStack_9c;
  *(undefined4 *)(out[3] + 1) = uStack_ac;
  *(undefined4 *)((long)out[3] + 0xc) = uStack_bc;
  return;
}

Assistant:

static inline void transpose_32bit_4x4(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 32 bit elements. Goes from:
  // in[0]: 00 01 02 03
  // in[1]: 10 11 12 13
  // in[2]: 20 21 22 23
  // in[3]: 30 31 32 33
  // to:
  // a0:    00 10 01 11
  // a1:    20 30 21 31
  // a2:    02 12 03 13
  // a3:    22 32 23 33

  const __m128i a0 = _mm_unpacklo_epi32(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi32(in[2], in[3]);
  const __m128i a2 = _mm_unpackhi_epi32(in[0], in[1]);
  const __m128i a3 = _mm_unpackhi_epi32(in[2], in[3]);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30
  // out[1]: 01 11 21 31
  // out[2]: 02 12 22 32
  // out[3]: 03 13 23 33
  out[0] = _mm_unpacklo_epi64(a0, a1);
  out[1] = _mm_unpackhi_epi64(a0, a1);
  out[2] = _mm_unpacklo_epi64(a2, a3);
  out[3] = _mm_unpackhi_epi64(a2, a3);
}